

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::MergeFrom
          (BayesianProbitRegressor_FeatureValueWeight *this,
          BayesianProbitRegressor_FeatureValueWeight *from)

{
  ulong uVar1;
  LogMessage *other;
  BayesianProbitRegressor_Gaussian *this_00;
  undefined1 *from_00;
  Arena *arena;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/BayesianProbitRegressor.pb.cc"
               ,0x1f5);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  from_00 = (undefined1 *)from->featureweight_;
  if ((BayesianProbitRegressor_Gaussian *)from_00 != (BayesianProbitRegressor_Gaussian *)0x0 &&
      from != (BayesianProbitRegressor_FeatureValueWeight *)
              _BayesianProbitRegressor_FeatureValueWeight_default_instance_) {
    this_00 = this->featureweight_;
    if (this_00 == (BayesianProbitRegressor_Gaussian *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      this_00 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::BayesianProbitRegressor_Gaussian>(arena);
      this->featureweight_ = this_00;
      from_00 = (undefined1 *)from->featureweight_;
    }
    if ((BayesianProbitRegressor_Gaussian *)from_00 == (BayesianProbitRegressor_Gaussian *)0x0) {
      from_00 = _BayesianProbitRegressor_Gaussian_default_instance_;
    }
    BayesianProbitRegressor_Gaussian::MergeFrom(this_00,(BayesianProbitRegressor_Gaussian *)from_00)
    ;
  }
  if (from->featurevalue_ != 0) {
    this->featurevalue_ = from->featurevalue_;
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void BayesianProbitRegressor_FeatureValueWeight::MergeFrom(const BayesianProbitRegressor_FeatureValueWeight& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_featureweight()) {
    _internal_mutable_featureweight()->::CoreML::Specification::BayesianProbitRegressor_Gaussian::MergeFrom(from._internal_featureweight());
  }
  if (from._internal_featurevalue() != 0) {
    _internal_set_featurevalue(from._internal_featurevalue());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}